

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::DebuggerScope::UpdateDueToByteCodeRegeneration
          (DebuggerScope *this,DiagExtraScopesType scopeType,int start,RegSlot scopeLocation)

{
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DebuggerScope *pDVar5;
  
  if (this->scopeType != scopeType && this->scopeType != DiagUnknownScope) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x171e,"(this->scopeType == scopeType)",
                                "The debugger scope type should not have changed when generating bytecode again."
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this->scopeType = scopeType;
  pDVar5 = this;
  do {
    (pDVar5->range).begin = start;
    pDVar5 = (pDVar5->siblingScope).ptr;
  } while (pDVar5 != (DebuggerScope *)0x0);
  pLVar1 = (this->scopeProperties).ptr;
  if (pLVar1 != (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)0x0) {
    (pLVar1->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).count
         = 0;
  }
  this->scopeLocation = scopeLocation;
  if ((this->siblingScope).ptr != (DebuggerScope *)0x0) {
    (this->siblingScope).ptr = (DebuggerScope *)0x0;
  }
  return;
}

Assistant:

void DebuggerScope::UpdateDueToByteCodeRegeneration(DiagExtraScopesType scopeType, int start, RegSlot scopeLocation)
    {
#if DBG
        if (this->scopeType != Js::DiagUnknownScope)
        {
            // If the scope is unknown, it was deserialized without a scope type.  Otherwise, it should not have changed.
            // The scope type can change on a re-parse in certain scenarios related to eval detection in legacy mode -> Winblue: 272122
            AssertMsg(this->scopeType == scopeType, "The debugger scope type should not have changed when generating bytecode again.");
        }
#endif // DBG

        this->scopeType = scopeType;
        this->SetBegin(start);
        if(this->scopeProperties)
        {
            this->scopeProperties->Clear();
        }

        // Reset the scope location as it may have changed during bytecode generation from the last run.
        this->SetScopeLocation(scopeLocation);

        if (siblingScope)
        {
            // If we had a sibling scope during initial parsing, clear it now so that it will be reset
            // when it is retrieved during this bytecode generation pass, in GetSiblingScope().
            // GetSiblingScope() will ensure that the FunctionBody currentDebuggerScopeIndex value is
            // updated accordingly to account for future scopes coming after the sibling.
            // Calling of GetSiblingScope() will happen when register properties are added to this scope
            // via TrackRegisterPropertyForDebugger().
            siblingScope = nullptr;
        }
    }